

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

void print_call_stat_params_table(dlog_mt_call_stat_params_t *call_stat_params)

{
  ulong uVar1;
  
  printf("\tStart time:     %02d:%02d\n",(ulong)call_stat_params->callstats_start_time[0],
         (ulong)call_stat_params->callstats_start_time[1]);
  printf("\tDuration:       %02dd\n",(ulong)call_stat_params->callstats_duration);
  printf("\tThreshold:      %02d\n",(ulong)call_stat_params->callstats_threshold);
  uVar1 = 0;
  do {
    printf("\tTimestamp[%d]:   %02d:%02d\n",uVar1 & 0xffffffff,
           (ulong)call_stat_params->timestamp[uVar1][0],(ulong)call_stat_params->timestamp[uVar1][1]
          );
    uVar1 = uVar1 + 1;
  } while (uVar1 != 4);
  printf("\tEnable:         0x%02x\n",(ulong)call_stat_params->enable);
  printf("\tCDR Threshold:  %d\n",(ulong)call_stat_params->cdr_threshold);
  printf("\tCDR Start Time: %02d:%02d\n",(ulong)call_stat_params->cdr_start_time[0],
         (ulong)call_stat_params->cdr_start_time[1]);
  printf("\tCDR Duration:   %dd:%dh\n",(ulong)call_stat_params->cdr_duration_days,
         (ulong)(call_stat_params->cdr_duration_hours_flags & 0x1f));
  printf("\tCDR Flags:      0x%02x\n",
         (ulong)(call_stat_params->cdr_duration_hours_flags & 0xffffffe0));
  return;
}

Assistant:

void print_call_stat_params_table(dlog_mt_call_stat_params_t* call_stat_params) {
    int i;

    printf("\tStart time:     %02d:%02d\n",
        call_stat_params->callstats_start_time[0], call_stat_params->callstats_start_time[1]);
    printf("\tDuration:       %02dd\n", call_stat_params->callstats_duration);
    printf("\tThreshold:      %02d\n", call_stat_params->callstats_threshold);

    for (i = 0; i < 4; i++) {
        printf("\tTimestamp[%d]:   %02d:%02d\n", i,
            call_stat_params->timestamp[i][0], call_stat_params->timestamp[i][1]);
    }

    printf("\tEnable:         0x%02x\n", call_stat_params->enable);
    printf("\tCDR Threshold:  %d\n", call_stat_params->cdr_threshold);
    printf("\tCDR Start Time: %02d:%02d\n",
        call_stat_params->cdr_start_time[0], call_stat_params->cdr_start_time[1]);
    printf("\tCDR Duration:   %dd:%dh\n", call_stat_params->cdr_duration_days, call_stat_params->cdr_duration_hours_flags & 0x1f);
    printf("\tCDR Flags:      0x%02x\n", call_stat_params->cdr_duration_hours_flags & 0xe0);
}